

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

void arkInterpFree_Lagrange(void *arkode_mem,ARKInterp I)

{
  void *__ptr;
  int *__ptr_00;
  long lVar1;
  long lVar2;
  int iVar4;
  undefined1 auVar3 [16];
  
  if (I == (ARKInterp)0x0 || arkode_mem == (void *)0x0) {
    return;
  }
  __ptr_00 = (int *)I->content;
  if (__ptr_00 != (int *)0x0) {
    if (*(long *)(__ptr_00 + 2) != 0) {
      lVar2 = 0;
      for (lVar1 = 0; __ptr = *(void **)(__ptr_00 + 2), lVar1 < *__ptr_00; lVar1 = lVar1 + 1) {
        if (*(long *)((long)__ptr + lVar2) != 0) {
          arkFreeVec((ARKodeMem)arkode_mem,(N_Vector *)((long)__ptr + lVar2));
          *(undefined8 *)(*(long *)((long)I->content + 8) + lVar2) = 0;
          __ptr_00 = (int *)I->content;
        }
        lVar2 = lVar2 + 8;
      }
      free(__ptr);
      __ptr_00 = (int *)I->content;
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
    }
    if (*(void **)(__ptr_00 + 4) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 4));
      __ptr_00 = (int *)I->content;
      __ptr_00[4] = 0;
      __ptr_00[5] = 0;
    }
    iVar4 = *__ptr_00 + 1;
    auVar3._4_4_ = *__ptr_00 + 2;
    auVar3._8_4_ = auVar3._4_4_;
    auVar3._12_4_ = -(uint)(auVar3._4_4_ < 0);
    *(long *)((long)arkode_mem + 0x218) =
         *(long *)((long)arkode_mem + 0x218) - CONCAT44(-(uint)(iVar4 < 0),iVar4);
    *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - auVar3._8_8_;
    free(__ptr_00);
    I->content = (void *)0x0;
  }
  free(I->ops);
  free(I);
  return;
}

Assistant:

void arkInterpFree_Lagrange(void* arkode_mem, ARKInterp I)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return;
  ark_mem = (ARKodeMem) arkode_mem;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) return;

  /* free content */
  if (I->content != NULL) {
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops) {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}